

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.cpp
# Opt level: O1

GdlRuleItem * __thiscall
GdlRule::LhsSelectorItemAt
          (GdlRule *this,GrpLineAndFile *lnf,int irit,string *staClassOrAt,string *param_4,
          string *staAlias)

{
  pointer pcVar1;
  int iVar2;
  GdlRuleItem *pGVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Cannot specify a selector in the lhs","");
  GrcErrorList::AddError(&g_errorList,0xc4b,&this->super_GdlObject,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)staClassOrAt);
  if (iVar2 == 0) {
    paVar5 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_","");
    pcVar1 = (staAlias->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + staAlias->_M_string_length);
    pGVar3 = LhsItemAt(this,lnf,irit,&local_70,&local_b0);
    _Var4._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      _Var4._M_p = local_70._M_dataplus._M_p;
    }
  }
  else {
    paVar5 = &local_90.field_2;
    pcVar1 = (staClassOrAt->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + staClassOrAt->_M_string_length);
    pcVar1 = (staAlias->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + staAlias->_M_string_length);
    pGVar3 = LhsItemAt(this,lnf,irit,&local_90,&local_d0);
    _Var4._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      _Var4._M_p = local_90._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
  }
  return pGVar3;
}

Assistant:

GdlRuleItem * GdlRule::LhsSelectorItemAt(GrpLineAndFile & lnf, int irit,
	std::string staClassOrAt, std::string /*staSel*/, std::string staAlias)
{
	g_errorList.AddError(3147, this,
		"Cannot specify a selector in the lhs");

	if (staClassOrAt == "@")
		return LhsItemAt(lnf, irit, "_", staAlias);
	else
		return LhsItemAt(lnf, irit, staClassOrAt, staAlias);
}